

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.h
# Opt level: O2

string * __thiscall
senjo::PerftCommandHandle::Usage_abi_cxx11_(string *__return_storage_ptr__,PerftCommandHandle *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,&this->command,
                 " [depth <x>] [count <x>] [skip <x>] [leafs <x>] [epd] [file <x> (default=");
  std::operator+(&local_50,&local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _TEST_FILE_abi_cxx11_);
  std::operator+(__return_storage_ptr__,&local_50,")]");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string Usage() const {
    return (command + " [depth <x>] [count <x>] [skip <x>] [leafs <x>] "
                      "[epd] [file <x> (default=" + _TEST_FILE + ")]");
  }